

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall icu_63::RangeDescriptor::RangeDescriptor(RangeDescriptor *this,UErrorCode *status)

{
  UErrorCode code;
  UBool UVar1;
  UVector *this_00;
  UVector *local_38;
  UErrorCode oldstatus;
  UErrorCode *status_local;
  RangeDescriptor *this_local;
  
  this->fStartChar = 0;
  this->fEndChar = 0;
  this->fNum = 0;
  this->fNext = (RangeDescriptor *)0x0;
  code = *status;
  this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status);
  local_38 = (UVector *)0x0;
  if (this_00 != (UVector *)0x0) {
    UVector::UVector(this_00,status);
    local_38 = this_00;
  }
  this->fIncludesSets = local_38;
  UVar1 = ::U_FAILURE(code);
  if (UVar1 != '\0') {
    *status = code;
  }
  UVar1 = ::U_FAILURE(*status);
  if ((UVar1 == '\0') && (this->fIncludesSets == (UVector *)0x0)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RangeDescriptor::RangeDescriptor(UErrorCode &status) {
    this->fStartChar    = 0;
    this->fEndChar      = 0;
    this->fNum          = 0;
    this->fNext         = NULL;
    UErrorCode oldstatus = status;
    this->fIncludesSets = new UVector(status);
    if (U_FAILURE(oldstatus)) {
        status = oldstatus;
    }
    if (U_FAILURE(status)) {
        return;
    }
    /* test for NULL */
    if(this->fIncludesSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

}